

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar2;
  LogMessage *pLVar3;
  CppType *pCVar4;
  CppType *pCVar5;
  MessageLite *pMVar6;
  LogMessage local_108;
  Voidify local_f1;
  CppType local_f0;
  CppType local_ec;
  Nullable<const_char_*> local_e8;
  LogMessage local_e0;
  Voidify local_c9;
  anon_enum_32 local_c8;
  anon_enum_32 local_c4;
  Nullable<const_char_*> local_c0;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_a1;
  CppType local_a0;
  CppType local_9c;
  Nullable<const_char_*> local_98;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  byte local_71;
  LogMessage local_70;
  Voidify local_59;
  Arena *local_58;
  Arena *message_arena;
  Arena *arena;
  MessageLite *message_local;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_30;
  int number_local;
  ExtensionSet *this_local;
  Arena *local_20;
  Arena *local_18;
  Arena *local_10;
  
  arena = (Arena *)message;
  message_local = (MessageLite *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_30 = this;
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
  }
  else {
    message_arena = this->arena_;
    local_58 = MessageLite::GetArena(message);
    local_71 = 0;
    if (local_58 != (Arena *)0x0 && local_58 != message_arena) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,700,"message_arena == nullptr || message_arena == arena");
      local_71 = 1;
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_59,pLVar3);
    }
    if ((local_71 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_70);
    }
    bVar1 = MaybeNewExtension(this,descriptor_local._4_4_,(FieldDescriptor *)message_local,
                              (Extension **)&absl_log_internal_check_op_result);
    if (bVar1) {
      absl_log_internal_check_op_result[8] = descriptor_local._3_1_;
      local_9c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
      pCVar4 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_9c)
      ;
      local_a0 = CPPTYPE_MESSAGE;
      pCVar5 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a0)
      ;
      local_98 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                           (pCVar4,pCVar5,
                            "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (local_98 != (Nullable<const_char_*>)0x0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2c1,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                           ((LogMessage *)&absl_log_internal_check_op_result_1);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
      }
      absl_log_internal_check_op_result[9] = '\0';
      absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfeU | 1;
      absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfb;
      if (local_58 == message_arena) {
        *(Arena **)absl_log_internal_check_op_result = arena;
      }
      else if (local_58 == (Arena *)0x0) {
        *(Arena **)absl_log_internal_check_op_result = arena;
        local_10 = message_arena;
        local_18 = arena;
        if (arena != (Arena *)0x0) {
          ThreadSafeArena::AddCleanup
                    (&message_arena->impl_,arena,arena_delete_object<google::protobuf::MessageLite>)
          ;
        }
      }
      else {
        pMVar6 = MessageLite::New((MessageLite *)arena,message_arena);
        *(MessageLite **)absl_log_internal_check_op_result = pMVar6;
        MessageLite::CheckTypeAndMergeFrom
                  (*(MessageLite **)absl_log_internal_check_op_result,(MessageLite *)arena);
      }
    }
    else {
      local_c4 = (anon_enum_32)((absl_log_internal_check_op_result[9] & 1U) == 0);
      v1 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_c4);
      local_c8 = OPTIONAL_FIELD;
      v2 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_c8);
      local_c0 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                           (v1,v2,
                            "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                           );
      if (local_c0 != (Nullable<const_char_*>)0x0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_c0);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2cf,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e0);
      }
      local_ec = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
      pCVar4 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_ec)
      ;
      local_f0 = CPPTYPE_MESSAGE;
      pCVar5 = absl::lts_20250127::log_internal::
               GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_f0)
      ;
      local_e8 = absl::lts_20250127::log_internal::
                 Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                           (pCVar4,pCVar5,
                            "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (local_e8 != (Nullable<const_char_*>)0x0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_e8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                   ,0x2cf,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_108);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_f1,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_108);
      }
      if (((byte)absl_log_internal_check_op_result[10] >> 2 & 1) == 0) {
        if ((message_arena == (Arena *)0x0) &&
           (*(long **)absl_log_internal_check_op_result != (long *)0x0)) {
          (**(code **)(**(long **)absl_log_internal_check_op_result + 8))();
        }
        if (local_58 == message_arena) {
          *(Arena **)absl_log_internal_check_op_result = arena;
        }
        else if (local_58 == (Arena *)0x0) {
          *(Arena **)absl_log_internal_check_op_result = arena;
          local_20 = message_arena;
          this_local = (ExtensionSet *)arena;
          if (arena != (Arena *)0x0) {
            ThreadSafeArena::AddCleanup
                      (&message_arena->impl_,arena,
                       arena_delete_object<google::protobuf::MessageLite>);
          }
        }
        else {
          pMVar6 = MessageLite::New((MessageLite *)arena,message_arena);
          *(MessageLite **)absl_log_internal_check_op_result = pMVar6;
          MessageLite::CheckTypeAndMergeFrom
                    (*(MessageLite **)absl_log_internal_check_op_result,(MessageLite *)arena);
        }
      }
      else {
        (**(code **)(**(long **)absl_log_internal_check_op_result + 0x30))
                  (*(long **)absl_log_internal_check_op_result,arena,message_arena);
      }
    }
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfd;
  }
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Arena* const arena = arena_;
  Arena* const message_arena = message->GetArena();
  ABSL_DCHECK(message_arena == nullptr || message_arena == arena);

  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    if (message_arena == arena) {
      extension->ptr.message_value = message;
    } else if (message_arena == nullptr) {
      extension->ptr.message_value = message;
      arena->Own(message);  // not nullptr because not equal to message_arena
    } else {
      extension->ptr.message_value = message->New(arena);
      extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->SetAllocatedMessage(message, arena);
    } else {
      if (arena == nullptr) {
        delete extension->ptr.message_value;
      }
      if (message_arena == arena) {
        extension->ptr.message_value = message;
      } else if (message_arena == nullptr) {
        extension->ptr.message_value = message;
        arena->Own(message);  // not nullptr because not equal to message_arena
      } else {
        extension->ptr.message_value = message->New(arena);
        extension->ptr.message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}